

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O3

int __thiscall BenevolentBotStrategy::numArmies(BenevolentBotStrategy *this)

{
  vector<CardType,_std::allocator<CardType>_> *pvVar1;
  pointer pCVar2;
  int iVar3;
  pointer pCVar4;
  
  pvVar1 = ((this->super_PlayerStrategy).player)->pCards->handPointer;
  pCVar4 = (pvVar1->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pCVar2 = (pvVar1->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar4 != pCVar2) {
    iVar3 = 0;
    do {
      iVar3 = iVar3 + (uint)(*pCVar4 == *(this->super_PlayerStrategy).exchangingCardType);
      pCVar4 = pCVar4 + 1;
    } while (pCVar4 != pCVar2);
    return iVar3;
  }
  return 0;
}

Assistant:

int BenevolentBotStrategy::numArmies() {
    int count = 0;
    for (auto cardType : *player->getCards()->getHand()) {
        if ((int) cardType == *exchangingCardType) {
            count++;
        }
    }
    return count;
}